

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

int __thiscall
CVmObjDate::formatDateGen
          (CVmObjDate *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc,multicaldate_t *date)

{
  int iVar1;
  vm_obj_id_t obj;
  char *pcVar2;
  CVmObject *pCVar3;
  int *in_RCX;
  vm_val_t *in_RDX;
  long *in_R8;
  CVmObjString *str;
  size_t buflen;
  CVmDateLocale lc;
  char *tzabbr;
  int32_t tzofs;
  int32_t daytime;
  int32_t dayno;
  CVmTimeZone *tz;
  size_t fmtlen;
  char *fmt;
  uint argc;
  CVmDateLocale *in_stack_000000e8;
  size_t in_stack_000000f0;
  char *in_stack_000000f8;
  size_t in_stack_00000100;
  char *in_stack_00000108;
  CVmObjDate *in_stack_00000110;
  multicaldate_t *in_stack_00000130;
  int32_t in_stack_00000138;
  int32_t in_stack_00000140;
  char *in_stack_00000148;
  int32_t in_stack_00000150;
  vm_val_t *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  uint in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff1c;
  int32_t *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  CVmDateLocale *in_stack_ffffffffffffff30;
  CVmObject *local_c8;
  int local_b4;
  undefined4 local_74;
  
  if (in_RCX == (int *)0x0) {
    local_b4 = 0;
  }
  else {
    local_b4 = *in_RCX;
  }
  if ((formatDateGen(unsigned_int,vm_val_t*,unsigned_int*,multicaldate_t*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&formatDateGen(unsigned_int,vm_val_t*,unsigned_int*,multicaldate_t*)
                                   ::desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&formatDateGen::desc,1,1);
    __cxa_guard_release(&formatDateGen(unsigned_int,vm_val_t*,unsigned_int*,multicaldate_t*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                     (uint *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (CVmNativeCodeDesc *)in_stack_ffffffffffffff08);
  if (iVar1 != 0) {
    return 1;
  }
  CVmStack::get(0);
  pcVar2 = vm_val_t::get_as_string(in_stack_ffffffffffffff08);
  if (pcVar2 == (char *)0x0) {
    err_throw(0);
  }
  vmb_get_len((char *)0x347458);
  get_tz_arg(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
  get_local_time((CVmObjDate *)in_stack_ffffffffffffff30,
                 (int32_t *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                 in_stack_ffffffffffffff20,
                 (int32_t *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 (CVmTimeZone *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  (**(code **)(*in_R8 + 0x18))(in_R8,local_74);
  CVmDateLocale::CVmDateLocale(in_stack_ffffffffffffff30);
  format_date(in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000f8,
              in_stack_000000f0,in_stack_000000e8,in_stack_00000130,in_stack_00000138,
              in_stack_00000140,in_stack_00000148,in_stack_00000150);
  obj = CVmObjString::create(in_stack_ffffffffffffff14,(size_t)in_R8);
  vm_val_t::set_obj(in_RDX,obj);
  if ((in_RDX->val).obj != 0) {
    pCVar3 = vm_objp(0);
    iVar1 = (*pCVar3->_vptr_CVmObject[1])(pCVar3,CVmObjString::metaclass_reg_);
    if (iVar1 != 0) {
      local_c8 = vm_objp(0);
      goto LAB_003475b2;
    }
  }
  local_c8 = (CVmObject *)0x0;
LAB_003475b2:
  CVmObjString::cons_get_buf((CVmObjString *)local_c8);
  format_date(in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000f8,
              in_stack_000000f0,in_stack_000000e8,in_stack_00000130,in_stack_00000138,
              in_stack_00000140,in_stack_00000148,in_stack_00000150);
  CVmStack::discard(local_b4);
  return 1;
}

Assistant:

int CVmObjDate::formatDateGen(VMG_ vm_obj_id_t self, vm_val_t *retval,
                              uint *oargc, multicaldate_t *date)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the format string */
    const char *fmt = G_stk->get(0)->get_as_string(vmg0_);
    if (fmt == 0)
        err_throw(VMERR_BAD_TYPE_BIF);

    /* get the format string length and buffer pointer */
    size_t fmtlen = vmb_get_len(fmt);
    fmt += VMB_LEN;

    /* get my date and time in local time */
    CVmTimeZone *tz = get_tz_arg(vmg_ 1, argc);
    int32_t dayno, daytime, tzofs;
    const char *tzabbr = get_local_time(dayno, daytime, tzofs, tz);

    /* convert the day number to a calendar date */
    date->set_dayno(dayno);

    /* do a formatting pass to determine how much space we need */
    CVmDateLocale lc Pvmg0_P;
    size_t buflen = format_date(
        vmg_ 0, 0, fmt, fmtlen, &lc, date, dayno, daytime, tzabbr, tzofs);

    /* create a string for the result */
    retval->set_obj(CVmObjString::create(vmg_ FALSE, buflen));
    CVmObjString *str = vm_objid_cast(CVmObjString, retval->val.obj);

    /* format the string into the buffer */
    format_date(vmg_ str->cons_get_buf(), buflen, fmt, fmtlen, &lc,
                date, dayno, daytime, tzabbr, tzofs);

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}